

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall kj::FdOutputStream::write(FdOutputStream *this,int __fd,void *__buf,size_t __n)

{
  int code;
  size_t sVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  uchar *puVar3;
  iovec *piVar4;
  void *pvVar5;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  bool bVar6;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar7;
  ArrayPtr<iovec> AVar8;
  Fault local_218;
  Fault f_1;
  long *local_208;
  undefined1 local_200 [8];
  DebugComparison<long_&,_int> _kjCondition;
  Fault f;
  SyscallResult local_1ac;
  undefined1 auStack_1a8 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  size_t iovCount;
  iovec *current;
  uint i;
  undefined1 local_180 [8];
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  bool iov_isOnStack;
  size_t iov_size;
  ArrayPtr<const_unsigned_char> *local_40;
  Detail *local_38;
  RemoveConst<kj::Exception::Detail> *local_30;
  size_t iovmax;
  FdOutputStream *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces_local;
  
  this_local = (FdOutputStream *)CONCAT44(in_register_00000034,__fd);
  pieces_local.ptr = (ArrayPtr<const_unsigned_char> *)__buf;
  while (sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                           ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local),
        0x400 < sVar1) {
    AVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::first
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0x400);
    local_38 = (Detail *)AVar7.ptr;
    local_30 = (RemoveConst<kj::Exception::Detail> *)AVar7.size_;
    (*(this->super_OutputStream)._vptr_OutputStream[3])(this,local_38,local_30);
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    AVar7 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0x400,sVar1
                      );
    iov_size = (size_t)AVar7.ptr;
    this_local = (FdOutputStream *)iov_size;
    local_40 = (ArrayPtr<const_unsigned_char> *)AVar7.size_;
    pieces_local.ptr = local_40;
  }
  sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  if (sVar1 < 0x11) {
    Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
    AVar8 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,sVar1);
  }
  else {
    heapArray<iovec>((Array<iovec> *)&iov.size_,sVar1);
    AVar8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
  }
  current._0_4_ = 0;
  while( true ) {
    iov.ptr = (iovec *)AVar8.size_;
    local_180 = (undefined1  [8])AVar8.ptr;
    sVar1 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
    if (sVar1 <= (uint)current) break;
    pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(uint)current);
    puVar3 = ArrayPtr<const_unsigned_char>::begin(pAVar2);
    piVar4 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_180,(ulong)(uint)current);
    piVar4->iov_base = puVar3;
    pAVar2 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(uint)current);
    sVar1 = ArrayPtr<const_unsigned_char>::size(pAVar2);
    piVar4 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_180,(ulong)(uint)current);
    AVar8.size_ = (size_t)iov.ptr;
    AVar8.ptr = (iovec *)local_180;
    piVar4->iov_len = sVar1;
    current._0_4_ = (uint)current + 1;
  }
  iovCount = (size_t)ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)local_180);
  while( true ) {
    piVar4 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
    bVar6 = false;
    if (iovCount < piVar4) {
      bVar6 = *(long *)(iovCount + 8) == 0;
    }
    if (!bVar6) break;
    iovCount = iovCount + 0x10;
  }
  while( true ) {
    piVar4 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
    if (piVar4 <= iovCount) {
      Array<iovec>::~Array((Array<iovec> *)&iov.size_);
      return extraout_RAX;
    }
    ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
    _auStack_1a8 = (char *)0x0;
    f.exception = (Exception *)auStack_1a8;
    local_1ac = kj::_::Debug::
                syscall<kj::FdOutputStream::write(kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>)::__0>
                          ((anon_class_32_4_4c4eba25 *)&f,false);
    pvVar5 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_1ac);
    if (pvVar5 == (void *)0x0) break;
    local_208 = (long *)kj::_::DebugExpressionStart::operator<<
                                  ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(long *)auStack_1a8)
    ;
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<long&>::operator>
              ((DebugComparison<long_&,_int> *)local_200,(DebugExpression<long&> *)&local_208,
               (int *)((long)&f_1.exception + 4));
    bVar6 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
    if (!bVar6) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<long&,int>&,char_const(&)[24]>
                (&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x1c4,FAILED,"n > 0","_kjCondition,\"writev() returned zero.\"",
                 (DebugComparison<long_&,_int> *)local_200,(char (*) [24])"writev() returned zero.")
      ;
      kj::_::Debug::Fault::fatal(&local_218);
    }
    while( true ) {
      piVar4 = ArrayPtr<iovec>::end((ArrayPtr<iovec> *)local_180);
      bVar6 = false;
      if (iovCount < piVar4) {
        bVar6 = *(char **)(iovCount + 8) <= _auStack_1a8;
      }
      if (!bVar6) break;
      _auStack_1a8 = _auStack_1a8 + -*(long *)(iovCount + 8);
      iovCount = iovCount + 0x10;
    }
    if (0 < (long)_auStack_1a8) {
      *(char **)iovCount = _auStack_1a8 + *(long *)iovCount;
      *(long *)(iovCount + 8) = *(long *)(iovCount + 8) - (long)_auStack_1a8;
    }
  }
  code = kj::_::Debug::SyscallResult::getErrorNumber(&local_1ac);
  kj::_::Debug::Fault::Fault<int,int&>
            ((Fault *)&_kjCondition.result,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
             ,0x1c3,code,"n = ::writev(fd, current, iovCount)","fd",&this->fd);
  kj::_::Debug::Fault::fatal((Fault *)&_kjCondition.result);
}

Assistant:

void FdOutputStream::write(ArrayPtr<const ArrayPtr<const byte>> pieces) {
#if _WIN32
  // Windows has no reasonable writev(). It has WriteFileGather, but this call has the unreasonable
  // restriction that each segment must be page-aligned. So, fall back to the default implementation
  for (auto piece: pieces) write(piece);
#else
  const size_t iovmax = miniposix::iovMax();
  while (pieces.size() > iovmax) {
    write(pieces.first(iovmax));
    pieces = pieces.slice(iovmax, pieces.size());
  }

  KJ_STACK_ARRAY(struct iovec, iov, pieces.size(), 16, 128);

  for (uint i = 0; i < pieces.size(); i++) {
    // writev() interface is not const-correct.  :(
    iov[i].iov_base = const_cast<byte*>(pieces[i].begin());
    iov[i].iov_len = pieces[i].size();
  }

  struct iovec* current = iov.begin();

  // Advance past any leading empty buffers so that a write full of only empty buffers does not
  // cause a syscall at all.
  while (current < iov.end() && current->iov_len == 0) {
    ++current;
  }

  while (current < iov.end()) {
    size_t iovCount = iov.end() - current;

#if __APPLE__
    // MacOS will fail if you give it more than INT_MAX bytes to write at once. We can solve this
    // by carefully truncating the list to a lesser number. Why the OS doesn't just return a short
    // write itself, I don't know.
    size_t totalSize = 0;
    struct iovec* editedPiece = nullptr;
    size_t editedPieceOriginalLen = 0;
    for (auto i: kj::zeroTo(iovCount)) {
      auto& piece = *(current + i);
      totalSize += piece.iov_len;
      if (totalSize >= WRITE_CLAMP_SIZE) {
        // Truncate the list after this piece.
        iovCount = i + 1;

        if (totalSize > WRITE_CLAMP_SIZE) {
          // We also have to truncate this piece. Patch it in-place and plan to fix it later.
          editedPiece = &piece;
          editedPieceOriginalLen = piece.iov_len;
          size_t overage = totalSize - WRITE_CLAMP_SIZE;
          piece.iov_len -= overage;
        }

        break;
      }
    }
#endif

    // Issue the write.
    ssize_t n = 0;
    KJ_SYSCALL(n = ::writev(fd, current, iovCount), fd);
    KJ_ASSERT(n > 0, "writev() returned zero.");

#if __APPLE__
    // If we patched the list above, unpatch now.
    if (editedPiece != nullptr) {
      editedPiece->iov_len = editedPieceOriginalLen;
    }
#endif

    // Advance past all buffers that were fully-written.
    while (current < iov.end() && static_cast<size_t>(n) >= current->iov_len) {
      n -= current->iov_len;
      ++current;
    }

    // If we only partially-wrote one of the buffers, adjust the pointer and size to include only
    // the unwritten part.
    if (n > 0) {
      current->iov_base = reinterpret_cast<byte*>(current->iov_base) + n;
      current->iov_len -= n;
    }
  }
#endif
}